

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Graph *graph,Reals *quality,
          Read<signed_char> *candidates)

{
  QualityCompare compare_00;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  LOs adj;
  LOs xadj;
  QualityCompare compare;
  undefined1 in_stack_ffffffffffffff20 [24];
  Write<int> local_c8;
  Write<int> local_b8;
  undefined1 local_a8 [48];
  QualityCompare local_78;
  QualityCompare local_50;
  
  Write<int>::Write((Write<int> *)(local_a8 + 0x20),(Write<int> *)graph);
  Write<int>::Write((Write<int> *)(local_a8 + 0x10),&(graph->ab2b).write_);
  local_78.global.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.global.write_.shared_alloc_.direct_ptr = (pointer)0x0;
  local_78.quality.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.quality.write_.shared_alloc_.direct_ptr = (pointer)0x0;
  Write<double>::operator=((Write<double> *)(local_a8 + 0x30),&quality->write_);
  Mesh::globals((Mesh *)local_a8,(Int)mesh);
  Write<long>::operator=(&local_78.global.write_,(Write<long> *)local_a8);
  Write<long>::~Write((Write<long> *)local_a8);
  Write<int>::Write(&local_b8,(Write<int> *)(local_a8 + 0x20));
  Write<int>::Write(&local_c8,(Write<int> *)(local_a8 + 0x10));
  Write<signed_char>::Write((Write<signed_char> *)&stack0xffffffffffffff28,&candidates->write_);
  QualityCompare::QualityCompare(&local_50,(QualityCompare *)(local_a8 + 0x30));
  compare_00.quality.write_.shared_alloc_.direct_ptr = (void *)in_stack_ffffffffffffff20._0_8_;
  compare_00.global.write_.shared_alloc_ =
       (Write<long>)(Write<long>)in_stack_ffffffffffffff20._8_16_;
  compare_00.quality.write_.shared_alloc_.alloc = (Alloc *)&local_50;
  indset::find<Omega_h::QualityCompare>
            ((indset *)this,mesh,ent_dim,(LOs *)&local_b8,(LOs *)&local_c8,
             (Read<signed_char> *)&stack0xffffffffffffff28,compare_00);
  QualityCompare::~QualityCompare(&local_50);
  Write<signed_char>::~Write((Write<signed_char> *)&stack0xffffffffffffff28);
  Write<int>::~Write(&local_c8);
  Write<int>::~Write(&local_b8);
  QualityCompare::~QualityCompare((QualityCompare *)(local_a8 + 0x30));
  Write<int>::~Write((Write<int> *)(local_a8 + 0x10));
  Write<int>::~Write((Write<int> *)(local_a8 + 0x20));
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Graph graph, Reals quality, Read<I8> candidates) {
  auto xadj = graph.a2ab;
  auto adj = graph.ab2b;
  QualityCompare compare;
  compare.quality = quality;
  compare.global = mesh->globals(ent_dim);
  return indset::find(mesh, ent_dim, xadj, adj, candidates, compare);
}